

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

bool ImPlot::IsPlotYAxisHovered(ImPlotYAxis y_axis_in)

{
  ImPlotPlot *pIVar1;
  
  if (3 < y_axis_in + 1U) {
    __assert_fail("(y_axis_in >= -1 && y_axis_in < 3) && \"y_axis needs to between -1 and IMPLOT_Y_AXES\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xa84,"bool ImPlot::IsPlotYAxisHovered(ImPlotYAxis)");
  }
  pIVar1 = GImPlot->CurrentPlot;
  if (pIVar1 != (ImPlotPlot *)0x0) {
    if (y_axis_in < 0) {
      y_axis_in = pIVar1->CurrentYAxis;
    }
    return pIVar1->YAxis[y_axis_in].ExtHovered;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"IsPlotYAxisHovered() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xa85,"bool ImPlot::IsPlotYAxisHovered(ImPlotYAxis)");
}

Assistant:

bool IsPlotYAxisHovered(ImPlotYAxis y_axis_in) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(y_axis_in >= -1 && y_axis_in < IMPLOT_Y_AXES, "y_axis needs to between -1 and IMPLOT_Y_AXES");
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "IsPlotYAxisHovered() needs to be called between BeginPlot() and EndPlot()!");
    const ImPlotYAxis y_axis = y_axis_in >= 0 ? y_axis_in : gp.CurrentPlot->CurrentYAxis;
    return gp.CurrentPlot->YAxis[y_axis].ExtHovered;
}